

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

int allphone_search_step(ps_search_t *search,int frame_idx)

{
  int32 frame_history_start_00;
  acmod_t *acmod_00;
  int32 best;
  int16 *senscr_00;
  acmod_t *acmod;
  allphone_search_t *allphs;
  int16 *senscr;
  int32 frame_history_start;
  int32 bestscr;
  int frame_idx_local;
  ps_search_t *search_local;
  
  acmod_00 = search->acmod;
  frame_history_start = frame_idx;
  _bestscr = search;
  if (acmod_00->compallsen == '\0') {
    allphone_search_sen_active((allphone_search_t *)search);
  }
  senscr_00 = acmod_score(acmod_00,&frame_history_start);
  *(int *)&search[1].dag = acmod_00->n_senone_active + *(int *)&search[1].dag;
  best = phmm_eval_all((allphone_search_t *)search,senscr_00);
  frame_history_start_00 = *(int32 *)&(search[1].last_link)->best_prev;
  phmm_exit((allphone_search_t *)search,best);
  phmm_trans((allphone_search_t *)search,best,frame_history_start_00);
  *(int *)&search[1].d2p = *(int *)&search[1].d2p + 1;
  return 0;
}

Assistant:

int
allphone_search_step(ps_search_t * search, int frame_idx)
{
    int32 bestscr, frame_history_start;
    const int16 *senscr;
    allphone_search_t *allphs = (allphone_search_t *) search;
    acmod_t *acmod = search->acmod;

    if (!acmod->compallsen)
        allphone_search_sen_active(allphs);
    senscr = acmod_score(acmod, &frame_idx);
    allphs->n_sen_eval += acmod->n_senone_active;
    bestscr = phmm_eval_all(allphs, senscr);

    frame_history_start = blkarray_list_n_valid(allphs->history);
    phmm_exit(allphs, bestscr);
    phmm_trans(allphs, bestscr, frame_history_start);

    allphs->frame++;

    return 0;
}